

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O0

void __thiscall OpenMD::NPTi::loadEta(NPTi *this)

{
  double *pdVar1;
  Snapshot *in_RDI;
  Mat3x3d etaMat;
  RectMatrix<double,_3U,_3U> local_50;
  
  Snapshot::getBarostat(in_RDI);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_50,0,0);
  (in_RDI->rigidbodyData).aMat.
  super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)*pdVar1;
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217c1c);
  return;
}

Assistant:

void NPTi::loadEta() {
    Mat3x3d etaMat = snap->getBarostat();
    eta            = etaMat(0, 0);
    // if (fabs(etaMat(1,1) - eta) >= OpenMD::epsilon || fabs(etaMat(1,1) - eta)
    // >= OpenMD::epsilon || !etaMat.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPTi error: the diagonal elements of  eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }